

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int StartScanRequestRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  ssize_t sVar2;
  char *__s;
  uint uVar3;
  uint uVar4;
  uchar reqbuf [2];
  int DataType;
  int SendMode;
  int DataResponseLength;
  undefined2 local_2e;
  int local_2c;
  int local_28;
  int local_24;
  
  local_2e = 0x20a5;
  uVar3 = 0;
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  __s = "Error writing data to a RPLIDAR. ";
  if (iVar1 - 1U < 4) {
    iVar1 = (pRPLIDAR->RS232Port).s;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_2e + (ulong)uVar3),(ulong)(2 - uVar3),0);
      if ((int)sVar2 < 1) goto LAB_001a9ac9;
      uVar3 = uVar3 + (int)sVar2;
    } while ((int)uVar3 < 2);
  }
  else {
    if (iVar1 != 0) goto LAB_001a9ac9;
    iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar3 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_2e + (ulong)uVar3),(ulong)(2 - uVar3));
      if ((int)sVar2 < 1) goto LAB_001a9ac9;
      uVar4 = uVar3 + (int)sVar2;
      uVar3 = 1;
    } while (uVar4 < 2);
  }
  iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&local_24,&local_28,&local_2c);
  if (iVar1 != 0) {
    return 1;
  }
  __s = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
  if (((local_24 == 5) && (local_28 == 1)) && (local_2c == 0x81)) {
    return 0;
  }
LAB_001a9ac9:
  puts(__s);
  return 1;
}

Assistant:

inline int StartScanRequestRPLIDAR(RPLIDAR* pRPLIDAR)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	if (SL_IS_FAIL(pRPLIDAR->drv->startScan(false, false)))
	{
		printf("A RPLIDAR is not responding correctly : startScan() failed. \n");
		return EXIT_FAILURE;
	}
	pRPLIDAR->nodes_cache->clear();
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,SCAN_REQUEST_RPLIDAR};
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR)||
		(SendMode != SINGLE_REQUEST_MULTIPLE_RESPONSE_SEND_MODE_RPLIDAR)||
		(DataType != MEASUREMENT_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}